

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall Fn_MultipleDefs_Test::~Fn_MultipleDefs_Test(Fn_MultipleDefs_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Fn, MultipleDefs) {
	MockParser mock(
		"let a = 3\n"
		"fn hello() {\n"
		"  let b = 4\n"
		"}\n"
		"fn hello2() {\n"
		"  let b = 5\n"
		"}\n"
		"fn hello3() {\n"
		"  let b = 6\n"
		"}\n"
		"let c = 7\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_F, 1, 1);
	INS2(BC_SET_F, 2, 2);
	INS2(BC_SET_F, 3, 3);
	INS2(BC_SET_N, 4, 4);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_SET_N, 0, 1);
	INS(BC_RET, 0, 0, 0);

	FN(2);
	INS2(BC_SET_N, 0, 2);
	INS(BC_RET, 0, 0, 0);

	FN(3);
	INS2(BC_SET_N, 0, 3);
	INS(BC_RET, 0, 0, 0);
}